

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Expression> __thiscall Parser::value(Parser *this)

{
  uint uVar1;
  void *pvVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 uVar4;
  undefined8 uVar5;
  bool bVar6;
  _Sp_cp_type *__mem;
  undefined8 *puVar7;
  uint *puVar8;
  undefined8 extraout_RAX;
  pointer pcVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined **ppuVar10;
  Parser *in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  TokenType *type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ptr<ObjectExpression> pVar13;
  ptr<ArrayExpression> pVar14;
  ptr<Expression> pVar15;
  initializer_list<TokenType> __l;
  allocator_type local_91;
  _Alloc_hider local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  unsigned_long local_58;
  _Alloc_hider _Stack_50;
  double local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_90._M_p = (pointer)0x3c0000003b;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_90;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            ((vector<TokenType,_std::allocator<TokenType>_> *)local_80,__l,&local_91);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._0_8_;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_80._4_4_,local_80._0_4_);
  while ((paVar12 != paVar11 && (bVar6 = match(in_RSI,*(TokenType *)paVar12), !bVar6))) {
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)paVar12 + 4);
  }
  pvVar2 = (void *)CONCAT44(local_80._4_4_,local_80._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_78._8_8_ - (long)pvVar2);
  }
  if (paVar12 != paVar11) {
    local_80._0_4_ = (in_RSI->currentToken).type;
    pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
    local_78._0_8_ = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
    uVar4 = local_80._0_4_;
    local_58 = (in_RSI->currentToken).line;
    _Stack_50._M_p = (pointer)(in_RSI->currentToken).col;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ != &local_68) {
      operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
    }
    consume(in_RSI);
    puVar7 = (undefined8 *)operator_new(0x28);
    puVar7[1] = 0x100000001;
    *puVar7 = &PTR___Sp_counted_ptr_inplace_001304a8;
    puVar7[2] = &PTR_evaluate_001304f8;
    puVar7[3] = &PTR__Member_0012f658;
    *(bool *)(puVar7 + 4) = uVar4 == True;
    pcVar9 = (pointer)(puVar7 + 2);
    ppuVar10 = (undefined **)extraout_RDX;
LAB_00110717:
    (this->filepath)._M_dataplus._M_p = pcVar9;
    (this->filepath)._M_string_length = (size_type)puVar7;
LAB_0011071e:
    pVar15.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar10;
    pVar15.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Expression>)pVar15.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
  }
  bVar6 = match(in_RSI,Number);
  if (!bVar6) {
LAB_00110417:
    bVar6 = match(in_RSI,SingleQuote);
    if (bVar6) {
      consume(in_RSI);
      local_80._0_4_ = (in_RSI->currentToken).type;
      pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
      local_78._0_8_ = &local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
      local_58 = (in_RSI->currentToken).line;
      _Stack_50._M_p = (pointer)(in_RSI->currentToken).col;
      local_90._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<PrimitiveExpression<String>,std::allocator<PrimitiveExpression<String>>,std::__cxx11::string&>
                (&local_88,(PrimitiveExpression<String> **)&local_90,
                 (allocator<PrimitiveExpression<String>_> *)&local_91,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      _Var3._M_pi = local_88._M_pi;
      (this->filepath)._M_dataplus._M_p = local_90._M_p;
      (this->filepath)._M_string_length = 0;
      local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->filepath)._M_string_length = (size_type)_Var3._M_pi;
      local_90._M_p = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
      }
      consume(in_RSI,String,"string");
      consume(in_RSI,SingleQuote,"\"\'\"");
      ppuVar10 = (undefined **)extraout_RDX_00;
    }
    else {
      bVar6 = match(in_RSI,DoubleQuote);
      if (bVar6) {
        consume(in_RSI);
        local_80._0_4_ = (in_RSI->currentToken).type;
        pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
        local_78._0_8_ = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length
                  );
        local_58 = (in_RSI->currentToken).line;
        _Stack_50._M_p = (pointer)(in_RSI->currentToken).col;
        local_90._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<PrimitiveExpression<String>,std::allocator<PrimitiveExpression<String>>,std::__cxx11::string&>
                  (&local_88,(PrimitiveExpression<String> **)&local_90,
                   (allocator<PrimitiveExpression<String>_> *)&local_91,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        _Var3._M_pi = local_88._M_pi;
        (this->filepath)._M_dataplus._M_p = local_90._M_p;
        (this->filepath)._M_string_length = 0;
        local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->filepath)._M_string_length = (size_type)_Var3._M_pi;
        local_90._M_p = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._0_8_ != &local_68) {
          operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
        }
        consume(in_RSI,String,"string");
        consume(in_RSI,DoubleQuote,"\'\"\'");
        ppuVar10 = (undefined **)extraout_RDX_01;
        goto LAB_0011071e;
      }
      bVar6 = match(in_RSI,LeftCurly);
      if (bVar6) {
        pVar13 = object((Parser *)local_80);
        ppuVar10 = (undefined **)
                   pVar13.super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      }
      else {
        bVar6 = match(in_RSI,LeftBrack);
        if (!bVar6) {
          bVar6 = match(in_RSI,Lambda);
          if (bVar6) {
            pVar15 = lambda(this);
            ppuVar10 = (undefined **)
                       pVar15.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi;
            goto LAB_0011071e;
          }
          goto LAB_001107c4;
        }
        pVar14 = array((Parser *)local_80);
        ppuVar10 = (undefined **)
                   pVar14.super___shared_ptr<ArrayExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
      }
      (this->filepath)._M_dataplus._M_p = (pointer)CONCAT44(local_80._4_4_,local_80._0_4_);
      (this->filepath)._M_string_length = 0;
      (this->filepath)._M_string_length = local_78._0_8_;
    }
    goto LAB_0011071e;
  }
  local_80._0_4_ = (in_RSI->currentToken).type;
  local_78._0_8_ = &local_68;
  pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
  uVar5 = local_78._0_8_;
  local_58 = (in_RSI->currentToken).line;
  _Stack_50._M_p = (pointer)(in_RSI->currentToken).col;
  puVar8 = (uint *)__errno_location();
  uVar1 = *puVar8;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)uVar1;
  *puVar8 = 0;
  local_40._8_8_ = strtoll((char *)uVar5,&local_90._M_p,10);
  if (local_90._M_p == (pointer)uVar5) {
    std::__throw_invalid_argument("stoll");
  }
  else {
    if (*puVar8 == 0) {
      *puVar8 = uVar1;
    }
    else if (*puVar8 == 0x22) {
      std::__throw_out_of_range("stoll");
      goto LAB_00110417;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ != &local_68) {
      operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
    }
    local_80._0_4_ = (in_RSI->currentToken).type;
    local_78._0_8_ = &local_68;
    pcVar9 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,pcVar9,pcVar9 + (in_RSI->currentToken).lexeme._M_string_length);
    uVar5 = local_78._0_8_;
    local_58 = (in_RSI->currentToken).line;
    _Stack_50._M_p = (pointer)(in_RSI->currentToken).col;
    uVar1 = *puVar8;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)uVar1;
    *puVar8 = 0;
    local_40._M_allocated_capacity = (size_type)strtod((char *)local_78._0_8_,&local_90._M_p);
    if (local_90._M_p != (pointer)uVar5) {
      if (*puVar8 == 0) {
LAB_00110656:
        *puVar8 = uVar1;
      }
      else if (*puVar8 == 0x22) {
        local_40._M_allocated_capacity = std::__throw_out_of_range("stod");
        goto LAB_00110656;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
      }
      consume(in_RSI);
      uVar5 = local_40._8_8_;
      local_48 = (double)(long)local_40._8_8_;
      puVar7 = (undefined8 *)operator_new(0x28);
      pcVar9 = (pointer)(puVar7 + 2);
      *puVar7 = &PTR___Sp_counted_base_0012e838;
      puVar7[1] = 0x100000001;
      if (((double)local_40._M_allocated_capacity != local_48) ||
         (NAN((double)local_40._M_allocated_capacity) || NAN(local_48))) {
        *puVar7 = &PTR___Sp_counted_ptr_inplace_001305c8;
        puVar7[2] = &PTR_evaluate_00130618;
        ppuVar10 = &PTR__Member_0012f4d8;
        puVar7[3] = &PTR__Member_0012f4d8;
        puVar7[4] = local_40._M_allocated_capacity;
      }
      else {
        *puVar7 = &PTR___Sp_counted_ptr_inplace_00130538;
        puVar7[2] = &PTR_evaluate_00130588;
        ppuVar10 = &PTR__Member_0012f598;
        puVar7[3] = &PTR__Member_0012f598;
        puVar7[4] = uVar5;
      }
      goto LAB_00110717;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_001107c4:
  unexpected(in_RSI);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != paVar11) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

ptr<Expression> Parser::value() {
    if(matchAny({ TokenType::True, TokenType::False })) {
        bool logicalValue = token().type == TokenType::True;
        consume();
        return make<PrimitiveExpression<Boolean>>(logicalValue);

    } else if(match(TokenType::Number)) {
        long long int integerValue = std::stoll(token().lexeme);
        double doubleValue = std::stod(token().lexeme);
        consume();

        if(integerValue == doubleValue) {
            return make<PrimitiveExpression<Integer>>(integerValue);
        }

        return make<PrimitiveExpression<Double>>(doubleValue);

    } else if(match(TokenType::SingleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::SingleQuote, "\"'\"");
        return expr;

    } else if(match(TokenType::DoubleQuote)) {
        consume();
        ptr<Expression> expr = make<PrimitiveExpression<String>>(token().lexeme);
        consume(TokenType::String, "string");
        consume(TokenType::DoubleQuote, "'\"'");
        return expr;

    } else if(match(TokenType::LeftCurly)) {
        return object();
    } else if(match(TokenType::LeftBrack)) {
        return array();
    } else if(match(TokenType::Lambda)) {
        return lambda();
    } else {
        unexpected();
    }
}